

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

KaxInternalBlock * __thiscall
libmatroska::KaxBlockBlob::operator_cast_to_KaxInternalBlock_(KaxBlockBlob *this)

{
  KaxBlockBlob *this_local;
  
  if ((this->Block).group != (KaxBlockGroup *)0x0) {
    if ((this->bUseSimpleBlock & 1U) == 0) {
      this_local = (KaxBlockBlob *)
                   KaxBlockGroup::operator_cast_to_KaxInternalBlock_((this->Block).group);
    }
    else {
      this_local = (KaxBlockBlob *)(this->Block).group;
    }
    return (KaxInternalBlock *)this_local;
  }
  __assert_fail("Block.group",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                ,0x3ba,
                "KaxInternalBlock &libmatroska::KaxBlockBlob::operator libmatroska::KaxInternalBlock &()"
               );
}

Assistant:

KaxBlockBlob::operator KaxInternalBlock &()
{
  assert(Block.group);
#if MATROSKA_VERSION >= 2
  if (bUseSimpleBlock)
    return *Block.simpleblock;
  else
#endif
    return *Block.group;
}